

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

idx_t duckdb::TernaryExecutor::
      SelectLoopSwitch<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::LowerInclusiveBetweenOperator>
                (UnifiedVectorFormat *adata,UnifiedVectorFormat *bdata,UnifiedVectorFormat *cdata,
                SelectionVector *sel,idx_t count,SelectionVector *true_sel,
                SelectionVector *false_sel)

{
  ValidityMask *avalidity;
  SelectionVector *pSVar1;
  interval_t *piVar2;
  SelectionVector *pSVar3;
  interval_t *piVar4;
  SelectionVector *pSVar5;
  interval_t *piVar6;
  idx_t iVar7;
  ValidityMask *pVVar8;
  ValidityMask *pVVar9;
  
  avalidity = &adata->validity;
  if ((((adata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) &&
      ((bdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
       (unsigned_long *)0x0)) &&
     ((cdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0)) {
    pVVar8 = &bdata->validity;
    pVVar9 = &cdata->validity;
    pSVar1 = adata->sel;
    piVar2 = (interval_t *)adata->data;
    pSVar3 = bdata->sel;
    piVar4 = (interval_t *)bdata->data;
    pSVar5 = cdata->sel;
    piVar6 = (interval_t *)cdata->data;
    if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
      if (true_sel == (SelectionVector *)0x0) {
        iVar7 = SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::LowerInclusiveBetweenOperator,true,false,true>
                          (piVar2,piVar4,piVar6,sel,count,pSVar1,pSVar3,pSVar5,avalidity,pVVar8,
                           pVVar9,(SelectionVector *)0x0,false_sel);
      }
      else {
        iVar7 = SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::LowerInclusiveBetweenOperator,true,true,false>
                          (piVar2,piVar4,piVar6,sel,count,pSVar1,pSVar3,pSVar5,avalidity,pVVar8,
                           pVVar9,true_sel,false_sel);
      }
    }
    else {
      iVar7 = SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::LowerInclusiveBetweenOperator,true,true,true>
                        (piVar2,piVar4,piVar6,sel,count,pSVar1,pSVar3,pSVar5,avalidity,pVVar8,pVVar9
                         ,true_sel,false_sel);
    }
  }
  else {
    pSVar1 = adata->sel;
    piVar2 = (interval_t *)adata->data;
    pSVar3 = bdata->sel;
    piVar4 = (interval_t *)bdata->data;
    pSVar5 = cdata->sel;
    piVar6 = (interval_t *)cdata->data;
    pVVar8 = &bdata->validity;
    pVVar9 = &cdata->validity;
    if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
      if (true_sel == (SelectionVector *)0x0) {
        iVar7 = SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::LowerInclusiveBetweenOperator,false,false,true>
                          (piVar2,piVar4,piVar6,sel,count,pSVar1,pSVar3,pSVar5,avalidity,pVVar8,
                           pVVar9,(SelectionVector *)0x0,false_sel);
      }
      else {
        iVar7 = SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::LowerInclusiveBetweenOperator,false,true,false>
                          (piVar2,piVar4,piVar6,sel,count,pSVar1,pSVar3,pSVar5,avalidity,pVVar8,
                           pVVar9,true_sel,false_sel);
      }
    }
    else {
      iVar7 = SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::LowerInclusiveBetweenOperator,false,true,true>
                        (piVar2,piVar4,piVar6,sel,count,pSVar1,pSVar3,pSVar5,avalidity,pVVar8,pVVar9
                         ,true_sel,false_sel);
    }
  }
  return iVar7;
}

Assistant:

static inline idx_t SelectLoopSwitch(UnifiedVectorFormat &adata, UnifiedVectorFormat &bdata,
	                                     UnifiedVectorFormat &cdata, const SelectionVector *sel, idx_t count,
	                                     SelectionVector *true_sel, SelectionVector *false_sel) {
		if (!adata.validity.AllValid() || !bdata.validity.AllValid() || !cdata.validity.AllValid()) {
			return SelectLoopSelSwitch<A_TYPE, B_TYPE, C_TYPE, OP, false>(adata, bdata, cdata, sel, count, true_sel,
			                                                              false_sel);
		} else {
			return SelectLoopSelSwitch<A_TYPE, B_TYPE, C_TYPE, OP, true>(adata, bdata, cdata, sel, count, true_sel,
			                                                             false_sel);
		}
	}